

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O2

int uarb_mult_digit(uarb acc,int a_digits,uarb num,int n_digits,png_uint_16 val)

{
  ulong uVar1;
  undefined2 in_register_00000082;
  uint uVar2;
  
  if (0 < n_digits && CONCAT22(in_register_00000082,val) != 0) {
    uVar1 = 0;
    for (uVar2 = 0; (uVar1 < (uint)n_digits || (uVar2 != 0)); uVar2 = uVar2 >> 0x10) {
      if ((long)uVar1 < (long)a_digits) {
        uVar2 = uVar2 + acc[uVar1];
      }
      if (uVar1 < (uint)n_digits) {
        uVar2 = uVar2 + (uint)num[uVar1] * CONCAT22(in_register_00000082,val);
      }
      acc[uVar1] = (png_uint_16)uVar2;
      uVar1 = uVar1 + 1;
    }
    if (a_digits < (int)uVar1) {
      a_digits = (int)uVar1;
    }
  }
  return a_digits;
}

Assistant:

static int
uarb_mult_digit(uarb acc, int a_digits, uarb num, int n_digits,
   png_uint_16 val)
   /* Primitive one-digit multiply - 'val' must be 0..65535. Note that this
    * primitive is a multiply and accumulate - the result of *num * val is added
    * to *acc.
    *
    * This is a one-digit multiply, so the product may be up to one digit longer
    * than 'num', however the add to 'acc' means that the caller must ensure
    * that 'acc' is at least one digit longer than this *and* at least one digit
    * longer than the current length of 'acc'.  (Or the caller must otherwise
    * ensure 'adigits' is adequate from knowledge of the values.)
    */
{
   /* The digits in *acc, *num and val are in the range 0..65535, so the
    * result below is at most (65535*65535)+2*65635 = 65535*(65535+2), which is
    * exactly 0xffffffff.
    */
   if (val > 0 && n_digits > 0) /* Else the product is 0 */
   {
      png_uint_32 carry = 0;
      int out_digits = 0;

      while (out_digits < n_digits || carry > 0)
      {
         if (out_digits < a_digits)
            carry += acc[out_digits];

         if (out_digits < n_digits)
            carry += (png_uint_32)num[out_digits] * val;

         acc[out_digits++] = (png_uint_16)(carry & 0xffff);
         carry >>= 16;
      }

      /* So carry is 0 and all the input digits have been consumed. This means
       * that it is possible to skip any remaining digits in acc.
       */
      if (out_digits > a_digits)
         return out_digits;
   }

   return a_digits;
}